

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PType * __thiscall
FTypeTable::FindType
          (FTypeTable *this,PClass *metatype,intptr_t parm1,intptr_t parm2,size_t *bucketnum)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  PType *pPVar3;
  
  sVar2 = Hash(metatype,parm1,parm2);
  if (bucketnum != (size_t *)0x0) {
    *bucketnum = sVar2 % 0x3fd;
  }
  pPVar3 = this->TypeHash[sVar2 % 0x3fd];
  while( true ) {
    if (pPVar3 == (PType *)0x0) {
      return (PType *)0x0;
    }
    if ((pPVar3->super_DObject).Class == (PClass *)0x0) {
      iVar1 = (**(pPVar3->super_DObject)._vptr_DObject)(pPVar3);
      (pPVar3->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar1);
    }
    if (((PClass *)
         (pPVar3->super_DObject).Class[1].super_PStruct.super_PNamedType.super_PCompoundType.
         super_PType.super_DObject._vptr_DObject == metatype) &&
       (iVar1 = (*(pPVar3->super_DObject)._vptr_DObject[0x13])(pPVar3,parm1,parm2),
       (char)iVar1 != '\0')) break;
    pPVar3 = pPVar3->HashNext;
  }
  return pPVar3;
}

Assistant:

PType *FTypeTable::FindType(PClass *metatype, intptr_t parm1, intptr_t parm2, size_t *bucketnum)
{
	size_t bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	if (bucketnum != NULL)
	{
		*bucketnum = bucket;
	}
	for (PType *type = TypeHash[bucket]; type != NULL; type = type->HashNext)
	{
		if (type->GetClass()->TypeTableType == metatype && type->IsMatch(parm1, parm2))
		{
			return type;
		}
	}
	return NULL;
}